

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDVertex::CompareUnorderedEdges(ON_SubDVertex *a,ON_SubDVertex *b)

{
  ON_SubDVertex *b_local;
  ON_SubDVertex *a_local;
  
  if (a == (ON_SubDVertex *)0x0) {
    a_local._4_4_ = -1;
    if (b == (ON_SubDVertex *)0x0) {
      a_local._4_4_ = 0;
    }
  }
  else if (b == (ON_SubDVertex *)0x0) {
    a_local._4_4_ = 1;
  }
  else if (a->m_edge_count < b->m_edge_count) {
    a_local._4_4_ = -1;
  }
  else if (b->m_edge_count < a->m_edge_count) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ =
         ComparePointerArrays((ulong)a->m_edge_count,&a->m_edges->m_ptr,&b->m_edges->m_ptr);
  }
  return a_local._4_4_;
}

Assistant:

int ON_SubDVertex::CompareUnorderedEdges(
  const ON_SubDVertex* a,
  const ON_SubDVertex* b
  )
{
  if (nullptr == a)
    return ((nullptr == b) ? 0 : -1);
  if (nullptr == b)
    return 1;

  if (a->m_edge_count < b->m_edge_count)
    return -1;
  if (a->m_edge_count > b->m_edge_count)
    return 1;
  return ComparePointerArrays(a->m_edge_count, (const ON__UINT_PTR*)a->m_edges, (const ON__UINT_PTR*)b->m_edges);
}